

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_Brep::InternalBrepBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_Brep *this,bool bLazy,bool bUpdateCachedBBox)

{
  ON_BrepFace *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  undefined7 in_register_00000011;
  long lVar8;
  ON_BoundingBox *this_00;
  long lVar9;
  long lVar10;
  ON_BoundingBox brep_bbox;
  ON_BoundingBox face_bbox;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  if ((int)CONCAT71(in_register_00000011,bLazy) != 0) {
    bVar7 = ON_BoundingBox::IsNotEmpty(&this->m_bbox);
    if (bVar7) {
      dVar2 = (this->m_bbox).m_min.x;
      dVar3 = (this->m_bbox).m_min.y;
      dVar4 = (this->m_bbox).m_min.z;
      dVar5 = (this->m_bbox).m_max.x;
      dVar6 = (this->m_bbox).m_max.z;
      (__return_storage_ptr__->m_max).y = (this->m_bbox).m_max.y;
      (__return_storage_ptr__->m_max).z = dVar6;
      (__return_storage_ptr__->m_min).z = dVar4;
      (__return_storage_ptr__->m_max).x = dVar5;
      (__return_storage_ptr__->m_min).x = dVar2;
      (__return_storage_ptr__->m_min).y = dVar3;
      return __return_storage_ptr__;
    }
  }
  ON_BoundingBox::ON_BoundingBox(&local_90);
  lVar8 = (long)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count;
  if (0 < lVar8) {
    lVar10 = 0x2c;
    lVar9 = 0;
    do {
      if ((*(int *)((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                     .m_a)->m_face_uuid).Data4 + lVar10 + -0x5c) != -1) &&
         (pOVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_a,
         pOVar1 != (ON_BrepFace *)0x0 &&
         lVar9 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_count)) {
        ON_BrepFace::InternalFaceBoundingBox
                  (&local_60,(ON_BrepFace *)((long)pOVar1 + lVar10 + -0x2c),bLazy,bUpdateCachedBBox)
        ;
        bVar7 = ON_BoundingBox::IsNotEmpty(&local_60);
        if (bVar7) {
          ON_BoundingBox::Union(&local_90,&local_60);
        }
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0xd8;
    } while (lVar8 != lVar9);
  }
  this_00 = &local_90;
  bVar7 = ON_BoundingBox::IsNotEmpty(this_00);
  if (!bVar7) {
    this_00 = &ON_BoundingBox::EmptyBoundingBox;
  }
  if (bUpdateCachedBBox && bVar7) {
    this_00 = &local_90;
    (this->m_bbox).m_max.y = local_90.m_max.y;
    (this->m_bbox).m_max.z = local_90.m_max.z;
    (this->m_bbox).m_min.z = local_90.m_min.z;
    (this->m_bbox).m_max.x = local_90.m_max.x;
    (this->m_bbox).m_min.x = local_90.m_min.x;
    (this->m_bbox).m_min.y = local_90.m_min.y;
  }
  dVar2 = (this_00->m_min).x;
  dVar3 = (this_00->m_min).y;
  dVar4 = (this_00->m_min).z;
  dVar5 = (this_00->m_max).x;
  dVar6 = (this_00->m_max).z;
  (__return_storage_ptr__->m_max).y = (this_00->m_max).y;
  (__return_storage_ptr__->m_max).z = dVar6;
  (__return_storage_ptr__->m_min).z = dVar4;
  (__return_storage_ptr__->m_max).x = dVar5;
  (__return_storage_ptr__->m_min).x = dVar2;
  (__return_storage_ptr__->m_min).y = dVar3;
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Brep::InternalBrepBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  ON_BoundingBox brep_bbox;
  const int face_count = m_F.Count();
  int fi;
  for (fi = 0; fi < face_count; fi++)
  {
    if (m_F[fi].m_face_index == -1)
      continue;

    //GBA 20 May 2020. RH-58462. Brep box now computed from face boxes, instead of surface boxes.
    const ON_BrepFace* f = Face(fi);
    if (nullptr == f)
      continue;

    const ON_BoundingBox face_bbox = f->InternalFaceBoundingBox(bLazy, bUpdateCachedBBox);
    if (false == face_bbox.IsNotEmpty())
      continue;

    brep_bbox.Union(face_bbox);
  }

  if (false == brep_bbox.IsNotEmpty())
  {
    // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
    // to indicate a bounding box is not set. If it were to be written
    // in modern times, it would have used Nans.
    return ON_BoundingBox::EmptyBoundingBox;
  }

  if (bUpdateCachedBBox)
    const_cast<ON_Brep*>(this)->m_bbox = brep_bbox;
  return brep_bbox;
}